

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::UniformCase::iterate(UniformCase *this)

{
  undefined4 uVar1;
  bool bVar2;
  deUint32 dVar3;
  uint uVar4;
  int iVar5;
  GLenum err;
  deBool dVar6;
  char *pcVar7;
  TestContext *this_00;
  CommandLine *this_01;
  TestLog *log_00;
  UniformCollection *pUVar8;
  Uniform *pUVar9;
  RenderContext *renderCtx;
  char *local_2d0;
  undefined1 local_258 [3];
  bool success;
  undefined1 local_188 [8];
  ShaderProgram program;
  string fragmentSource;
  string vertexSource;
  int i;
  int samplerUnitCounter;
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  basicUniformReportsRef;
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  basicUniforms;
  TestLog *log;
  Random rnd;
  UniformCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  pcVar7 = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(pcVar7);
  this_00 = gles2::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getCommandLine(this_00);
  uVar4 = tcu::CommandLine::getBaseSeed(this_01);
  de::Random::Random((Random *)&log,dVar3 ^ uVar4);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  ::vector((vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
            *)&basicUniformReportsRef.
               super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  ::vector((vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
            *)&i);
  vertexSource.field_2._12_4_ = 0;
  vertexSource.field_2._8_4_ = 0;
  while( true ) {
    uVar1 = vertexSource.field_2._8_4_;
    pUVar8 = de::SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    iVar5 = anon_unknown_1::UniformCollection::getNumUniforms(pUVar8);
    if (iVar5 <= (int)uVar1) break;
    pUVar8 = de::SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    pUVar9 = anon_unknown_1::UniformCollection::getUniform(pUVar8,vertexSource.field_2._8_4_);
    pUVar8 = de::SharedPtr<const_deqp::gles2::Functional::(anonymous_namespace)::UniformCollection>
             ::operator->(&this->m_uniformCollection);
    anon_unknown_1::UniformCollection::getUniform(pUVar8,vertexSource.field_2._8_4_);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    generateBasicUniforms
              (this,(vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                     *)&basicUniformReportsRef.
                        super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                *)&i,&pUVar9->type,pcVar7,true,(int *)(vertexSource.field_2._M_local_buf + 0xc),
               (Random *)&log);
    vertexSource.field_2._8_4_ = vertexSource.field_2._8_4_ + 1;
  }
  generateVertexSource_abi_cxx11_
            ((string *)((long)&fragmentSource.field_2 + 8),this,
             (vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
              *)&basicUniformReportsRef.
                 super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  generateFragmentSource_abi_cxx11_
            ((string *)&program.m_program.m_info.linkTimeUs,this,
             (vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
              *)&basicUniformReportsRef.
                 super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  renderCtx = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  glu::makeVtxFragSources
            ((ProgramSources *)local_258,(string *)((long)&fragmentSource.field_2 + 8),
             (string *)&program.m_program.m_info.linkTimeUs);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_188,renderCtx,(ProgramSources *)local_258);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_258);
  glu::operator<<(log_00,(ShaderProgram *)local_188);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_188);
  if (bVar2) {
    do {
      dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_188);
      glu::CallLogWrapper::glUseProgram(&this->super_CallLogWrapper,dVar3);
      err = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
      glu::checkError(err,"glUseProgram(program.getProgram())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                      ,0x6e5);
      dVar6 = ::deGetFalse();
    } while (dVar6 != 0);
    uVar4 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                      (this,&basicUniformReportsRef.
                             super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,&i,local_188,&log);
    if ((uVar4 & 1) == 0) {
      local_2d0 = "Failed";
    }
    else {
      local_2d0 = "Passed";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)((uVar4 & 1) == 0),local_2d0);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Compile failed");
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_188);
  std::__cxx11::string::~string((string *)&program.m_program.m_info.linkTimeUs);
  std::__cxx11::string::~string((string *)(fragmentSource.field_2._M_local_buf + 8));
  std::
  vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
  ::~vector((vector<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
             *)&i);
  std::
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  ::~vector((vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
             *)&basicUniformReportsRef.
                super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniformReportRef,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniformReportRef>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)&log);
  return STOP;
}

Assistant:

UniformCase::IterateResult UniformCase::iterate (void)
{
	Random							rnd				(deStringHash(getName()) ^ (deUint32)m_context.getTestContext().getCommandLine().getBaseSeed());
	TestLog&						log				= m_testCtx.getLog();
	vector<BasicUniform>			basicUniforms;
	vector<BasicUniformReportRef>	basicUniformReportsRef;

	{
		int samplerUnitCounter = 0;
		for (int i = 0; i < (int)m_uniformCollection->getNumUniforms(); i++)
			generateBasicUniforms(basicUniforms, basicUniformReportsRef, m_uniformCollection->getUniform(i).type, m_uniformCollection->getUniform(i).name.c_str(), true, samplerUnitCounter, rnd);
	}

	const string					vertexSource	= generateVertexSource(basicUniforms);
	const string					fragmentSource	= generateFragmentSource(basicUniforms);
	const ShaderProgram				program			(m_context.getRenderContext(), glu::makeVtxFragSources(vertexSource, fragmentSource));

	log << program;

	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	GLU_CHECK_CALL(glUseProgram(program.getProgram()));

	const bool success = test(basicUniforms, basicUniformReportsRef, program, rnd);
	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							success ? "Passed"				: "Failed");

	return STOP;
}